

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize2.h
# Opt level: O1

void stbir__horizontal_gather_1_channels_with_4_coeffs
               (float *output_buffer,uint output_sub_size,float *decode_buffer,
               stbir__contributors *horizontal_contributors,float *horizontal_coefficients,
               int coefficient_width)

{
  float *pfVar1;
  float *pfVar2;
  
  pfVar1 = output_buffer + output_sub_size;
  do {
    pfVar2 = decode_buffer + horizontal_contributors->n0;
    *output_buffer =
         pfVar2[3] * horizontal_coefficients[3] + pfVar2[1] * horizontal_coefficients[1] +
         pfVar2[2] * horizontal_coefficients[2] + *pfVar2 * *horizontal_coefficients;
    horizontal_contributors = horizontal_contributors + 1;
    output_buffer = output_buffer + 1;
    horizontal_coefficients = horizontal_coefficients + coefficient_width;
  } while (output_buffer < pfVar1);
  return;
}

Assistant:

static void STBIR_chans( stbir__horizontal_gather_,_channels_with_4_coeffs)( float * output_buffer, unsigned int output_sub_size, float const * decode_buffer, stbir__contributors const * horizontal_contributors, float const * horizontal_coefficients, int coefficient_width )
{
  float const * output_end = output_buffer + output_sub_size * STBIR__horizontal_channels;
  float STBIR_SIMD_STREAMOUT_PTR( * ) output = output_buffer;
  STBIR_SIMD_NO_UNROLL_LOOP_START
  do {
    float const * decode = decode_buffer + horizontal_contributors->n0 * STBIR__horizontal_channels;
    float const * hc = horizontal_coefficients;
    stbir__4_coeff_start();
    stbir__store_output();
  } while ( output < output_end );
}